

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseAssign(Ver_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  char *pErrorMessage;
  Ver_Stream_t *p;
  bool bVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  char *key;
  size_t sVar6;
  void *pvVar7;
  void **ppvVar8;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *pAVar10;
  Mio_Library_t *pMVar11;
  Mio_Gate_t *pMVar12;
  Vec_Ptr_t *pVVar13;
  ulong uVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  uint uVar20;
  uint Value;
  char Buffer [1000];
  char Buffer2 [2000];
  uint local_bfc;
  char local_bf8 [1008];
  char local_808 [2008];
  
  p = pMan->pReader;
  iVar4 = Ver_ParseConvertNetwork(pMan,pNtk,pMan->fMapped);
  if ((iVar4 != 0) && (key = Ver_ParseGetName(pMan), key != (char *)0x0)) {
    pErrorMessage = pMan->sError;
    do {
      if (((*key != '#') || (key[1] != '1')) || (key[2] != '\0')) {
        uVar16 = 0xffffffff;
        if (pMan->tName2Suffix == (st__table *)0x0) {
          uVar20 = 0xffffffff;
        }
        else {
          iVar4 = st__lookup(pMan->tName2Suffix,key,(char **)&local_bfc);
          uVar20 = 0xffffffff;
          if (iVar4 != 0) {
            uVar16 = local_bfc >> 8 & 0xff;
            uVar20 = local_bfc & 0xff;
          }
        }
        uVar5 = uVar16 - uVar20;
        uVar2 = -uVar5;
        if (0 < (int)uVar5) {
          uVar2 = uVar5;
        }
        if ((((int)uVar16 < 0) || ((int)uVar20 < 0)) || (uVar16 == uVar20)) {
          bVar1 = true;
          if ((*key == '{') && (pMan->fNameLast == 0)) {
            sVar6 = strlen(key + 1);
            key[sVar6] = '\0';
            if (key[1] == '\\') {
              __assert_fail("pWord[0] != \'\\\\\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                            ,0x4ad,"int Ver_ParseAssign(Ver_Man_t *, Abc_Ntk_t *)");
            }
            bVar1 = false;
            key = key + 1;
          }
          pAVar9 = Ver_ParseFindNet(pNtk,key);
          if (pAVar9 == (Abc_Obj_t *)0x0) {
            pcVar15 = "Cannot read the assign statement for %s (output wire is not defined).";
          }
          else {
            cVar3 = Ver_StreamPopChar(p);
            if (cVar3 == '=') {
              iVar4 = Ver_ParseSkipComments(pMan);
              if (iVar4 == 0) {
                return 0;
              }
              pcVar15 = ";";
              if (bVar1) {
                pcVar15 = ",;";
              }
              pcVar15 = Ver_StreamGetWord(p,pcVar15);
              if (pcVar15 != (char *)0x0) {
                pVVar13 = pMan->vNames;
                pVVar13->nSize = 0;
                if (pMan->fMapped == 0) {
                  cVar3 = *pcVar15;
                  if ((((cVar3 == '0') && (pcVar15[1] == '\0')) ||
                      (iVar4 = strcmp(pcVar15,"1\'b0"), iVar4 == 0)) ||
                     (iVar4 = strcmp(pcVar15,"1\'bx"), iVar4 == 0)) {
                    pMVar12 = (Mio_Gate_t *)(*(ulong *)((long)pNtk->pManFunc + 0x18) ^ 1);
                  }
                  else if (((cVar3 == '1') && (pcVar15[1] == '\0')) ||
                          (iVar4 = strcmp(pcVar15,"1\'b1"), iVar4 == 0)) {
                    pMVar12 = *(Mio_Gate_t **)((long)pNtk->pManFunc + 0x18);
                  }
                  else if (bVar1) {
                    pMVar12 = (Mio_Gate_t *)
                              Ver_FormulaParser(pcVar15,pNtk->pManFunc,pVVar13,pMan->vStackFn,
                                                pMan->vStackOp,pErrorMessage);
                  }
                  else {
                    pMVar12 = (Mio_Gate_t *)
                              Ver_FormulaReduction(pcVar15,pNtk->pManFunc,pVVar13,pErrorMessage);
                  }
                  if (pMVar12 == (Mio_Gate_t *)0x0) goto LAB_00352c4e;
                }
                else {
                  iVar4 = strcmp(pcVar15,"1\'b0");
                  if (iVar4 == 0) {
                    pMVar11 = (Mio_Library_t *)Abc_FrameReadLibGen();
                    pMVar12 = Mio_LibraryReadConst0(pMVar11);
                  }
                  else {
                    iVar4 = strcmp(pcVar15,"1\'b1");
                    if (iVar4 == 0) {
                      pMVar11 = (Mio_Library_t *)Abc_FrameReadLibGen();
                      pMVar12 = Mio_LibraryReadConst1(pMVar11);
                    }
                    else {
                      pcVar18 = pcVar15;
                      if (*pcVar15 == '\\') {
                        pcVar18 = pcVar15 + 1;
                        sVar6 = strlen(pcVar18);
                        pcVar15[sVar6] = '\0';
                      }
                      pAVar10 = Ver_ParseFindNet(pNtk,pcVar18);
                      if (pAVar10 == (Abc_Obj_t *)0x0) {
                        memcpy(pErrorMessage,
                               "Cannot read Verilog with non-trivial assignments in the mapped netlist."
                               ,0x48);
                        goto LAB_00352c4e;
                      }
                      pVVar13 = pMan->vNames;
                      pvVar7 = (void *)strlen(pcVar18);
                      uVar16 = pVVar13->nSize;
                      if (uVar16 == pVVar13->nCap) {
                        if ((int)uVar16 < 0x10) {
                          if (pVVar13->pArray == (void **)0x0) {
                            ppvVar8 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar8 = (void **)realloc(pVVar13->pArray,0x80);
                          }
                          pVVar13->pArray = ppvVar8;
                          pVVar13->nCap = 0x10;
                        }
                        else {
                          if (pVVar13->pArray == (void **)0x0) {
                            ppvVar8 = (void **)malloc((ulong)uVar16 << 4);
                          }
                          else {
                            ppvVar8 = (void **)realloc(pVVar13->pArray,(ulong)uVar16 << 4);
                          }
                          pVVar13->pArray = ppvVar8;
                          pVVar13->nCap = uVar16 * 2;
                        }
                      }
                      else {
                        ppvVar8 = pVVar13->pArray;
                      }
                      iVar4 = pVVar13->nSize;
                      pVVar13->nSize = iVar4 + 1;
                      ppvVar8[iVar4] = pvVar7;
                      pVVar13 = pMan->vNames;
                      uVar16 = pVVar13->nSize;
                      if (uVar16 == pVVar13->nCap) {
                        if ((int)uVar16 < 0x10) {
                          if (pVVar13->pArray == (void **)0x0) {
                            ppvVar8 = (void **)malloc(0x80);
                          }
                          else {
                            ppvVar8 = (void **)realloc(pVVar13->pArray,0x80);
                          }
                          pVVar13->pArray = ppvVar8;
                          pVVar13->nCap = 0x10;
                        }
                        else {
                          if (pVVar13->pArray == (void **)0x0) {
                            ppvVar8 = (void **)malloc((ulong)uVar16 << 4);
                          }
                          else {
                            ppvVar8 = (void **)realloc(pVVar13->pArray,(ulong)uVar16 << 4);
                          }
                          pVVar13->pArray = ppvVar8;
                          pVVar13->nCap = uVar16 * 2;
                        }
                      }
                      else {
                        ppvVar8 = pVVar13->pArray;
                      }
                      iVar4 = pVVar13->nSize;
                      pVVar13->nSize = iVar4 + 1;
                      ppvVar8[iVar4] = pcVar18;
                      pMVar11 = (Mio_Library_t *)Abc_FrameReadLibGen();
                      pMVar12 = Mio_LibraryReadBuf(pMVar11);
                      if (pMVar12 == (Mio_Gate_t *)0x0) {
                        key = Abc_ObjName(pAVar9);
                        pcVar15 = 
                        "Reading assign statement for node %s has failed because the genlib library has no buffer."
                        ;
                        goto LAB_00352c82;
                      }
                    }
                  }
                }
                pAVar10 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
                (pAVar10->field_5).pData = pMVar12;
                Abc_ObjAddFanin(pAVar9,pAVar10);
                pVVar13 = pMan->vNames;
                uVar16 = pVVar13->nSize;
                if (1 < (int)uVar16) {
                  uVar14 = 1;
                  lVar17 = 0;
                  do {
                    if (((long)(int)uVar16 <= (long)(uVar14 - 1)) || (uVar16 <= uVar14))
                    goto LAB_00352d2b;
                    pcVar15 = (char *)pVVar13->pArray[uVar14];
                    pcVar15[*(int *)(pVVar13->pArray + (uVar14 - 1))] = '\0';
                    iVar4 = strcmp(pcVar15,"1\'h0");
                    pcVar18 = "1\'b0";
                    if ((iVar4 != 0) &&
                       (iVar4 = strcmp(pcVar15,"1\'h1"), pcVar18 = pcVar15, iVar4 == 0)) {
                      pcVar18 = "1\'b1";
                    }
                    pAVar9 = Ver_ParseFindNet(pNtk,pcVar18);
                    if (pAVar9 == (Abc_Obj_t *)0x0) {
                      sprintf(pErrorMessage,
                              "Cannot read the assign statement for %s (input wire %s is not defined)."
                              ,key,pcVar15);
                      goto LAB_00352c4e;
                    }
                    Abc_ObjAddFanin(pAVar10,pAVar9);
                    lVar17 = lVar17 + 1;
                    pVVar13 = pMan->vNames;
                    uVar16 = pVVar13->nSize;
                    uVar14 = uVar14 + 2;
                  } while (lVar17 < (int)uVar16 / 2);
                }
                goto LAB_00352bec;
              }
              key = Abc_ObjName(pAVar9);
              pcVar15 = "Cannot read the equation for %s.";
            }
            else {
              pcVar15 = "Cannot read the assign statement for %s (expected equality sign).";
            }
          }
        }
        else {
          iVar4 = strcmp(key,"1\'h0");
          if (iVar4 == 0) {
            builtin_strncpy(local_bf8,"1\'b0",5);
          }
          else {
            iVar4 = strcmp(key,"1\'h1");
            if (iVar4 == 0) {
              builtin_strncpy(local_bf8,"1\'b1",5);
            }
            else {
              strcpy(local_bf8,key);
            }
          }
          cVar3 = Ver_StreamPopChar(p);
          if (cVar3 != '=') {
            pcVar15 = "Cannot read the assign statement for %s (expected equality sign).";
LAB_00352c82:
            sprintf(pErrorMessage,pcVar15,key);
            goto LAB_00352c4e;
          }
          key = Ver_ParseGetName(pMan);
          if (key == (char *)0x0) {
            return 0;
          }
          if ((byte)(*key - 0x30U) < 10) {
            iVar4 = Ver_ParseConstant(pMan,key);
            if (iVar4 == 0) {
              return 0;
            }
            uVar5 = pMan->vNames->nSize;
            if (uVar2 + 1 != uVar5) {
              sprintf(pErrorMessage,
                      "The constant size (%d) is different from the signal\"%s\" size (%d).",
                      (ulong)uVar5,local_bf8);
              goto LAB_00352c4e;
            }
            bVar1 = (int)uVar20 < (int)uVar16;
            uVar14 = (ulong)uVar2;
            uVar19 = (ulong)(uVar2 + 1);
            do {
              if (((long)uVar14 < 0) || ((long)pMan->vNames->nSize <= (long)uVar14)) {
LAB_00352d2b:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pcVar15 = "1\'b0";
              if (pMan->vNames->pArray[uVar14] != (void *)0x0) {
                pcVar15 = "1\'b1";
              }
              pAVar9 = Ver_ParseFindNet(pNtk,pcVar15);
              if (pAVar9 == (Abc_Obj_t *)0x0) {
                __assert_fail("pNet != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                              ,0x490,"int Ver_ParseAssign(Ver_Man_t *, Abc_Ntk_t *)");
              }
              pAVar9 = Abc_NtkCreateNodeBuf(pNtk,pAVar9);
              sprintf(local_808,"%s[%d]",local_bf8,(ulong)uVar20);
              pAVar10 = Ver_ParseFindNet(pNtk,local_808);
              if (pAVar10 == (Abc_Obj_t *)0x0) {
                pcVar15 = "Cannot read the assign statement for %s (output wire is not defined).";
                goto LAB_00352c26;
              }
              Abc_ObjAddFanin(pAVar10,pAVar9);
              uVar20 = uVar20 + (uint)bVar1 * 2 + -1;
              uVar14 = uVar14 - 1;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
            Ver_ParseSkipComments(pMan);
LAB_00352bec:
            cVar3 = Ver_StreamPopChar(p);
            if (cVar3 == ';') {
              return 1;
            }
            goto LAB_00352bfa;
          }
          pcVar15 = "Currently can only assign vector-signal \"%s\" to be a constant.";
          key = local_bf8;
        }
LAB_00352c26:
        sprintf(pErrorMessage,pcVar15,key);
LAB_00352c4e:
        Ver_ParsePrintErrorMessage(pMan);
        return 0;
      }
LAB_00352bfa:
      key = Ver_ParseGetName(pMan);
    } while (key != (char *)0x0);
  }
  return 0;
}

Assistant:

int Ver_ParseAssign( Ver_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    char Buffer[1000], Buffer2[2000];
    Ver_Stream_t * p = pMan->pReader;
    Abc_Obj_t * pNode, * pNet;
    char * pWord, * pName, * pEquation;
    Hop_Obj_t * pFunc;
    char Symbol;
    int i, Bit, Limit, Length, fReduction;
    int nMsb, nLsb;

//    if ( Ver_StreamGetLineNumber(p) == 2756 )
//    {
//        int x = 0;
//    }

    // convert from the blackbox into the network with local functions representated by AIGs
    if ( !Ver_ParseConvertNetwork( pMan, pNtk, pMan->fMapped ) )
        return 0;

    while ( 1 )
    {
        // get the name of the output signal
        pWord = Ver_ParseGetName( pMan );
        if ( pWord == NULL )
            return 0;
        if ( strcmp(pWord, "#1") == 0 )
            continue;
        // check for vector-inputs
        if ( !Ver_ParseLookupSuffix( pMan, pWord, &nMsb, &nLsb ) )
            return 0;
        // handle special case of constant assignment
        Limit = nMsb > nLsb? nMsb - nLsb + 1: nLsb - nMsb + 1;
        if ( nMsb >= 0 && nLsb >= 0 && Limit > 1 )
        {
            // save the fanout name
            if ( !strcmp(pWord, "1\'h0") )
                strcpy( Buffer, "1\'b0" );
            else if ( !strcmp(pWord, "1\'h1") )
                strcpy( Buffer, "1\'b1" );
            else
                strcpy( Buffer, pWord );
            // get the equality sign
            if ( Ver_StreamPopChar(p) != '=' )
            {
                sprintf( pMan->sError, "Cannot read the assign statement for %s (expected equality sign).", pWord );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            // get the constant
            pWord = Ver_ParseGetName( pMan );
            if ( pWord == NULL )
                return 0;
            // check if it is indeed a constant
            if ( !(pWord[0] >= '0' && pWord[0] <= '9') )
            {
                sprintf( pMan->sError, "Currently can only assign vector-signal \"%s\" to be a constant.", Buffer );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }

            // get individual bits of the constant
            if ( !Ver_ParseConstant( pMan, pWord ) )
                return 0;
            // check that the constant has the same size
            Limit = nMsb > nLsb? nMsb - nLsb + 1: nLsb - nMsb + 1;
            if ( Limit != Vec_PtrSize(pMan->vNames) )
            {
                sprintf( pMan->sError, "The constant size (%d) is different from the signal\"%s\" size (%d).", 
                    Vec_PtrSize(pMan->vNames), Buffer, Limit );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            // iterate through the bits
            for ( i = 0, Bit = nLsb; i < Limit; i++, Bit = nMsb > nLsb ? Bit + 1: Bit - 1  )
            {
                // get the fanin net
                if ( Vec_PtrEntry( pMan->vNames, Limit-1-i ) )
                    pNet = Ver_ParseFindNet( pNtk, "1\'b1" );
                else
                    pNet = Ver_ParseFindNet( pNtk, "1\'b0" );
                assert( pNet != NULL );

                // create the buffer
                pNode = Abc_NtkCreateNodeBuf( pNtk, pNet );

                // get the fanout net
                sprintf( Buffer2, "%s[%d]", Buffer, Bit );
                pNet = Ver_ParseFindNet( pNtk, Buffer2 );
                if ( pNet == NULL )
                {
                    sprintf( pMan->sError, "Cannot read the assign statement for %s (output wire is not defined).", pWord );
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
                Abc_ObjAddFanin( pNet, pNode );
            }
            // go to the end of the line
            Ver_ParseSkipComments( pMan );
        }
        else
        {
            // consider the case of reduction operations
            fReduction = 0;
            if ( pWord[0] == '{' && !pMan->fNameLast )
                fReduction = 1;
            if ( fReduction )
            {
                pWord++;
                pWord[strlen(pWord)-1] = 0;
                assert( pWord[0] != '\\' );
            }
            // get the fanout net
            pNet = Ver_ParseFindNet( pNtk, pWord );
            if ( pNet == NULL )
            {
                sprintf( pMan->sError, "Cannot read the assign statement for %s (output wire is not defined).", pWord );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            // get the equality sign
            if ( Ver_StreamPopChar(p) != '=' )
            {
                sprintf( pMan->sError, "Cannot read the assign statement for %s (expected equality sign).", pWord );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }
            // skip the comments
            if ( !Ver_ParseSkipComments( pMan ) )
                return 0;
            // get the second name
            if ( fReduction )
                pEquation = Ver_StreamGetWord( p, ";" );
            else
                pEquation = Ver_StreamGetWord( p, ",;" );
            if ( pEquation == NULL )
            {
                sprintf( pMan->sError, "Cannot read the equation for %s.", Abc_ObjName(pNet) );
                Ver_ParsePrintErrorMessage( pMan );
                return 0;
            }

            // consider the case of mapped network
            Vec_PtrClear( pMan->vNames );
            if ( pMan->fMapped )
            {
                if ( !strcmp( pEquation, "1\'b0" ) )
                    pFunc = (Hop_Obj_t *)Mio_LibraryReadConst0((Mio_Library_t *)Abc_FrameReadLibGen());
                else if ( !strcmp( pEquation, "1\'b1" ) )
                    pFunc = (Hop_Obj_t *)Mio_LibraryReadConst1((Mio_Library_t *)Abc_FrameReadLibGen());
                else
                {
                    // "assign foo = \bar ;"
                    if ( *pEquation == '\\' )
                    {
                        pEquation++;
                        pEquation[strlen(pEquation) - 1] = 0;
                    }
                    if ( Ver_ParseFindNet(pNtk, pEquation) == NULL )
                    {
                        sprintf( pMan->sError, "Cannot read Verilog with non-trivial assignments in the mapped netlist." );
                        Ver_ParsePrintErrorMessage( pMan );
                        return 0;
                    }
                    Vec_PtrPush( pMan->vNames, (void *)(ABC_PTRUINT_T)strlen(pEquation) );
                    Vec_PtrPush( pMan->vNames, pEquation );
                    // get the buffer
                    pFunc = (Hop_Obj_t *)Mio_LibraryReadBuf((Mio_Library_t *)Abc_FrameReadLibGen());
                    if ( pFunc == NULL )
                    {
                        sprintf( pMan->sError, "Reading assign statement for node %s has failed because the genlib library has no buffer.", Abc_ObjName(pNet) );
                        Ver_ParsePrintErrorMessage( pMan );
                        return 0;
                    }
                }
            }
            else
            {
                if ( !strcmp(pEquation, "0") || !strcmp(pEquation, "1\'b0") || !strcmp(pEquation, "1\'bx") )
                    pFunc = Hop_ManConst0((Hop_Man_t *)pNtk->pManFunc);
                else if ( !strcmp(pEquation, "1") || !strcmp(pEquation, "1\'b1") )
                    pFunc = Hop_ManConst1((Hop_Man_t *)pNtk->pManFunc);
                else if ( fReduction )
                    pFunc = (Hop_Obj_t *)Ver_FormulaReduction( pEquation, pNtk->pManFunc, pMan->vNames, pMan->sError );  
                else
                    pFunc = (Hop_Obj_t *)Ver_FormulaParser( pEquation, pNtk->pManFunc, pMan->vNames, pMan->vStackFn, pMan->vStackOp, pMan->sError );  
                if ( pFunc == NULL )
                {
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
            }

            // create the node with the given inputs
            pNode = Abc_NtkCreateNode( pNtk );
            pNode->pData = pFunc;
            Abc_ObjAddFanin( pNet, pNode );
            // connect to fanin nets
            for ( i = 0; i < Vec_PtrSize(pMan->vNames)/2; i++ )
            {
                // get the name of this signal
                Length = (int)(ABC_PTRUINT_T)Vec_PtrEntry( pMan->vNames, 2*i );
                pName  = (char *)Vec_PtrEntry( pMan->vNames, 2*i + 1 );
                pName[Length] = 0;
                // try name
//                pNet = Ver_ParseFindNet( pNtk, pName );
                if ( !strcmp(pName, "1\'h0") )
                    pNet = Ver_ParseFindNet( pNtk, "1\'b0" );
                else if ( !strcmp(pName, "1\'h1") )
                    pNet = Ver_ParseFindNet( pNtk, "1\'b1" );
                else
                    pNet = Ver_ParseFindNet( pNtk, pName );
                // find the corresponding net
                if ( pNet == NULL )
                {
                    sprintf( pMan->sError, "Cannot read the assign statement for %s (input wire %s is not defined).", pWord, pName );
                    Ver_ParsePrintErrorMessage( pMan );
                    return 0;
                }
                Abc_ObjAddFanin( pNode, pNet );
            }
        }

        Symbol = Ver_StreamPopChar(p);
        if ( Symbol == ',' )
            continue;
        if ( Symbol == ';' )
            return 1;
    }
    return 1;
}